

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint rgba8ToPixel(uchar *out,size_t i,LodePNGColorMode *mode,ColorTree *tree,uchar r,uchar g,uchar b
                 ,uchar a)

{
  uint in;
  uchar gray_1;
  int index;
  uchar gray;
  uchar g_local;
  uchar r_local;
  ColorTree *tree_local;
  LodePNGColorMode *mode_local;
  size_t i_local;
  uchar *out_local;
  
  if (mode->colortype == LCT_GREY) {
    if (mode->bitdepth == 8) {
      out[i] = r;
    }
    else if (mode->bitdepth == 0x10) {
      out[i * 2 + 1] = r;
      out[i * 2] = r;
    }
    else {
      addColorBits(out,i,mode->bitdepth,
                   (uint)(byte)(r >> (8U - (char)mode->bitdepth & 0x1f) &
                               (char)(1 << ((byte)mode->bitdepth & 0x1f)) - 1U));
    }
  }
  else if (mode->colortype == LCT_RGB) {
    if (mode->bitdepth == 8) {
      out[i * 3] = r;
      out[i * 3 + 1] = g;
      out[i * 3 + 2] = b;
    }
    else {
      out[i * 6 + 1] = r;
      out[i * 6] = r;
      out[i * 6 + 3] = g;
      out[i * 6 + 2] = g;
      out[i * 6 + 5] = b;
      out[i * 6 + 4] = b;
    }
  }
  else if (mode->colortype == LCT_PALETTE) {
    in = color_tree_get(tree,r,g,b,a);
    if ((int)in < 0) {
      return 0x52;
    }
    if (mode->bitdepth == 8) {
      out[i] = (uchar)in;
    }
    else {
      addColorBits(out,i,mode->bitdepth,in);
    }
  }
  else if (mode->colortype == LCT_GREY_ALPHA) {
    if (mode->bitdepth == 8) {
      out[i * 2] = r;
      out[i * 2 + 1] = a;
    }
    else if (mode->bitdepth == 0x10) {
      out[i * 4 + 1] = r;
      out[i * 4] = r;
      out[i * 4 + 3] = a;
      out[i * 4 + 2] = a;
    }
  }
  else if (mode->colortype == LCT_RGBA) {
    if (mode->bitdepth == 8) {
      out[i * 4] = r;
      out[i * 4 + 1] = g;
      out[i * 4 + 2] = b;
      out[i * 4 + 3] = a;
    }
    else {
      out[i * 8 + 1] = r;
      out[i * 8] = r;
      out[i * 8 + 3] = g;
      out[i * 8 + 2] = g;
      out[i * 8 + 5] = b;
      out[i * 8 + 4] = b;
      out[i * 8 + 7] = a;
      out[i * 8 + 6] = a;
    }
  }
  return 0;
}

Assistant:

static unsigned rgba8ToPixel(unsigned char* out, size_t i,
                             const LodePNGColorMode* mode, ColorTree* tree /*for palette*/,
                             unsigned char r, unsigned char g, unsigned char b, unsigned char a) {
  if(mode->colortype == LCT_GREY) {
    unsigned char gray = r; /*((unsigned short)r + g + b) / 3u;*/
    if(mode->bitdepth == 8) out[i] = gray;
    else if(mode->bitdepth == 16) out[i * 2 + 0] = out[i * 2 + 1] = gray;
    else {
      /*take the most significant bits of gray*/
      gray = ((unsigned)gray >> (8u - mode->bitdepth)) & ((1u << mode->bitdepth) - 1u);
      addColorBits(out, i, mode->bitdepth, gray);
    }
  } else if(mode->colortype == LCT_RGB) {
    if(mode->bitdepth == 8) {
      out[i * 3 + 0] = r;
      out[i * 3 + 1] = g;
      out[i * 3 + 2] = b;
    } else {
      out[i * 6 + 0] = out[i * 6 + 1] = r;
      out[i * 6 + 2] = out[i * 6 + 3] = g;
      out[i * 6 + 4] = out[i * 6 + 5] = b;
    }
  } else if(mode->colortype == LCT_PALETTE) {
    int index = color_tree_get(tree, r, g, b, a);
    if(index < 0) return 82; /*color not in palette*/
    if(mode->bitdepth == 8) out[i] = index;
    else addColorBits(out, i, mode->bitdepth, (unsigned)index);
  } else if(mode->colortype == LCT_GREY_ALPHA) {
    unsigned char gray = r; /*((unsigned short)r + g + b) / 3u;*/
    if(mode->bitdepth == 8) {
      out[i * 2 + 0] = gray;
      out[i * 2 + 1] = a;
    } else if(mode->bitdepth == 16) {
      out[i * 4 + 0] = out[i * 4 + 1] = gray;
      out[i * 4 + 2] = out[i * 4 + 3] = a;
    }
  } else if(mode->colortype == LCT_RGBA) {
    if(mode->bitdepth == 8) {
      out[i * 4 + 0] = r;
      out[i * 4 + 1] = g;
      out[i * 4 + 2] = b;
      out[i * 4 + 3] = a;
    } else {
      out[i * 8 + 0] = out[i * 8 + 1] = r;
      out[i * 8 + 2] = out[i * 8 + 3] = g;
      out[i * 8 + 4] = out[i * 8 + 5] = b;
      out[i * 8 + 6] = out[i * 8 + 7] = a;
    }
  }

  return 0; /*no error*/
}